

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walHashGet(Wal *pWal,int iHash,WalHashLoc *pLoc)

{
  int iVar1;
  Wal *in_RDX;
  int in_ESI;
  int rc;
  u32 **in_stack_ffffffffffffffd8;
  
  iVar1 = walIndexPage(in_RDX,-0x55555556,in_stack_ffffffffffffffd8);
  if (in_RDX->pDbFd == (sqlite3_file *)0x0) {
    if (iVar1 == 0) {
      iVar1 = 1;
    }
  }
  else {
    in_RDX->pVfs = (sqlite3_vfs *)(in_RDX->pDbFd + 0x800);
    if (in_ESI == 0) {
      in_RDX->pDbFd = in_RDX->pDbFd + 0x11;
      *(undefined4 *)&in_RDX->pWalFd = 0;
    }
    else {
      *(int *)&in_RDX->pWalFd = (in_ESI + -1) * 0x1000 + 0xfde;
    }
  }
  return iVar1;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  WalHashLoc *pLoc                /* OUT: Hash table location */
){
  int rc;                         /* Return code */

  rc = walIndexPage(pWal, iHash, &pLoc->aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( pLoc->aPgno ){
    pLoc->aHash = (volatile ht_slot *)&pLoc->aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      pLoc->aPgno = &pLoc->aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      pLoc->iZero = 0;
    }else{
      pLoc->iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
  }else if( NEVER(rc==SQLITE_OK) ){
    rc = SQLITE_ERROR;
  }
  return rc;
}